

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall
AmpIO::GetCollectionStatus(AmpIO *this,bool *collecting,uchar *chan,unsigned_short *writeAddr)

{
  uint32_t uVar1;
  unsigned_short *writeAddr_local;
  uchar *chan_local;
  bool *collecting_local;
  AmpIO *this_local;
  
  uVar1 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar1 < 7) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar1 == 0x44514c41) {
      this_local._7_1_ = false;
    }
    else {
      *collecting = (this->ReadBuffer[3] & 0x80000000) != 0;
      *chan = ((byte)(this->ReadBuffer[3] >> 0x18) & 0x3c) >> 2;
      *writeAddr = (ushort)(this->ReadBuffer[3] >> 0x10) & 0x3ff;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::GetCollectionStatus(bool &collecting, unsigned char &chan, unsigned short &writeAddr) const
{
    if (GetFirmwareVersion() < 7) return false;
    if (GetHardwareVersion() == DQLA_String)
        return false;

    collecting = (ReadBuffer[TEMP_OFFSET]&0x80000000);
    chan = (ReadBuffer[TEMP_OFFSET]&0x3c000000)>>26;
    writeAddr = (ReadBuffer[TEMP_OFFSET]&0x03ff0000)>>16;;
    return true;
}